

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_str_remove_runes(nk_str *str,int len)

{
  int pos;
  char *pcVar1;
  nk_rune unicode;
  int local_10;
  nk_rune local_c;
  
  local_10 = len;
  if (str == (nk_str *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x2159,"void nk_str_remove_runes(struct nk_str *, int)");
  }
  if (-1 < len) {
    pos = str->len - len;
    if (pos == 0 || str->len < len) {
      str->len = 0;
    }
    else {
      pcVar1 = nk_str_at_rune(str,pos,&local_c,&local_10);
      nk_str_remove_chars(str,((*(int *)&(str->buffer).memory.ptr + (int)(str->buffer).allocated) -
                              (int)pcVar1) + 1);
    }
    return;
  }
  __assert_fail("len >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x215a,"void nk_str_remove_runes(struct nk_str *, int)");
}

Assistant:

NK_API void
nk_str_remove_runes(struct nk_str *str, int len)
{
    int index;
    const char *begin;
    const char *end;
    nk_rune unicode;

    NK_ASSERT(str);
    NK_ASSERT(len >= 0);
    if (!str || len < 0) return;
    if (len >= str->len) {
        str->len = 0;
        return;
    }

    index = str->len - len;
    begin = nk_str_at_rune(str, index, &unicode, &len);
    end = (const char*)str->buffer.memory.ptr + str->buffer.allocated;
    nk_str_remove_chars(str, (int)(end-begin)+1);
}